

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall tinygltf::Accessor::operator==(Accessor *this,Accessor *other)

{
  bool bVar1;
  __type _Var2;
  vector<double,_std::allocator<double>_> *in_RSI;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Value *in_stack_ffffffffffffffd8;
  bool local_11;
  Value *__rhs;
  
  local_11 = false;
  if ((((*(int *)&((_Rep_type *)&in_RDI->type_)->_M_impl ==
         *(int *)&(in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start) &&
       (local_11 = false,
       *(pointer *)((long)&(in_RDI->string_value_).field_2 + 8) ==
       in_RSI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage)) &&
      (local_11 = false,
      *(int *)((long)&(in_RDI->binary_value_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) ==
      *(int *)((long)&in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 4))) &&
     (local_11 = false,
     (pointer)(in_RDI->binary_value_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
     in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish)) {
    __rhs = in_RDI;
    bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_RDI,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_stack_ffffffffffffffd8);
    local_11 = false;
    if (bVar1) {
      bVar1 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
      local_11 = false;
      if (bVar1) {
        bVar1 = Equals((vector<double,_std::allocator<double>_> *)__rhs,in_RSI);
        local_11 = false;
        if (bVar1) {
          bVar1 = Equals((vector<double,_std::allocator<double>_> *)__rhs,in_RSI);
          local_11 = false;
          if (bVar1) {
            _Var2 = std::operator==(unaff_retaddr,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs);
            local_11 = false;
            if ((_Var2) &&
               (local_11 = false,
               (*(byte *)&(in_RDI->binary_value_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start & 1) ==
               (*(byte *)&in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start & 1))) {
              local_11 = *(int *)&(in_RDI->binary_value_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage ==
                         *(int *)&in_RSI[2].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Accessor::operator==(const Accessor &other) const {
  return this->bufferView == other.bufferView &&
         this->byteOffset == other.byteOffset &&
         this->componentType == other.componentType &&
         this->count == other.count && this->extensions == other.extensions &&
         this->extras == other.extras &&
         Equals(this->maxValues, other.maxValues) &&
         Equals(this->minValues, other.minValues) && this->name == other.name &&
         this->normalized == other.normalized && this->type == other.type;
}